

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O1

int coda_ascii_cursor_get_bit_size(coda_cursor *cursor,int64_t *bit_size)

{
  coda_native_type cVar1;
  int *piVar2;
  coda_product *product;
  coda_product_struct *pcVar3;
  anon_struct_24_3_5e6533e2 *paVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  size_t __n;
  long lVar8;
  int64_t length;
  char *pcVar9;
  coda_cursor *cursor_00;
  long lVar10;
  coda_type *pcVar11;
  long *plVar12;
  long lVar13;
  bool bVar14;
  uint8_t buffer_3 [1];
  int64_t bit_size_boundary;
  char buffer [64];
  coda_cursor spec_cursor;
  uint8_t local_3b1;
  coda_cursor *local_3b0;
  long *local_3a8;
  long local_3a0;
  long *local_398;
  anon_struct_24_3_5e6533e2 *local_390;
  char local_388 [64];
  coda_cursor local_348;
  
  pcVar11 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar11->format) {
    pcVar11 = *(coda_type **)&pcVar11->type_class;
  }
  lVar7 = pcVar11->bit_size;
  if (-1 < lVar7) goto LAB_0011ab18;
  if (pcVar11->type_class < 2) {
    iVar5 = coda_ascbin_cursor_get_bit_size(cursor,bit_size);
    return iVar5;
  }
  lVar7 = cursor->stack[(long)cursor->n + -1].bit_offset;
  iVar5 = get_bit_size_boundary(cursor,&local_3a0,-1);
  if (iVar5 != 0) {
    return -1;
  }
  iVar5 = pcVar11->type_class;
  local_3b0 = cursor;
  if (iVar5 - 2U < 2) {
    plVar12 = (long *)pcVar11[1].description;
    bVar14 = true;
    if (plVar12 == (long *)0x0) {
      bVar14 = pcVar11->size_expr == (coda_expression *)0x0;
    }
  }
  else if (iVar5 == 4) {
    bVar14 = pcVar11->size_expr == (coda_expression *)0x0;
    if (!bVar14) goto LAB_0011abe7;
    plVar12 = (long *)0x0;
    if (pcVar11[1].type_class == coda_record_class) goto LAB_0011ad5b;
  }
  else if ((iVar5 == 6) && (pcVar11[1].format == 2)) {
    if (*(int *)(*(long *)&pcVar11[1].type_class + 8) != 4) {
      __assert_fail("base_type->type_class == coda_text_class",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                    ,0x2be,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
    }
    plVar12 = (long *)0x0;
    if (*(int *)(*(long *)&pcVar11[1].type_class + 0x40) == 0) {
LAB_0011ad5b:
      *bit_size = local_3a0;
      return 0;
    }
    bVar14 = false;
  }
  else {
    bVar14 = false;
LAB_0011abe7:
    plVar12 = (long *)0x0;
  }
  length = -1;
  local_390 = cursor->stack;
  if (bVar14) {
    length = 0x40;
    if (local_3a0 >> 3 < 0x40) {
      length = local_3a0 >> 3;
    }
    iVar5 = read_bytes_in_bounds(cursor->product,lVar7 >> 3,length,local_388);
    if (iVar5 != 0) {
      return -1;
    }
  }
  if (plVar12 != (long *)0x0) {
    lVar7 = plVar12[1];
    local_3a8 = bit_size;
    local_398 = plVar12;
    if (0 < (long)(int)lVar7) {
      lVar8 = plVar12[2];
      lVar13 = 0;
      do {
        piVar2 = *(int **)(lVar8 + lVar13 * 8);
        iVar5 = *piVar2;
        __n = (size_t)iVar5;
        if (__n == 0) {
          if (length == 0) {
            *local_3a8 = 0;
            return 0;
          }
        }
        else if (((long)__n <= length) &&
                (iVar6 = bcmp(*(void **)(piVar2 + 2),local_388,__n), iVar6 == 0)) {
          *local_3a8 = (long)(iVar5 << 3);
          return 0;
        }
        lVar13 = lVar13 + 1;
      } while ((int)lVar7 != lVar13);
    }
    lVar7 = *local_398;
    bit_size = local_3a8;
    if (-1 < lVar7) goto LAB_0011acbe;
  }
  paVar4 = local_390;
  cursor_00 = local_3b0;
  iVar5 = pcVar11->type_class;
  if (iVar5 == 6) {
    memcpy(&local_348,local_3b0,0x310);
    iVar5 = coda_cursor_use_base_type_of_special_type(&local_348);
    if (iVar5 == 0) {
      iVar5 = coda_cursor_get_bit_size(&local_348,bit_size);
      return iVar5;
    }
    return -1;
  }
  if (pcVar11->size_expr != (coda_expression *)0x0) {
    iVar5 = coda_expression_eval_integer(pcVar11->size_expr,local_3b0,bit_size);
    if (iVar5 == 0) {
      if (pcVar11->bit_size == -8) {
        *bit_size = *bit_size << 3;
      }
      if (-1 < *bit_size) {
        return 0;
      }
      coda_set_error(-300,"calculated size is negative (%ld bits)");
      cursor_00 = local_3b0;
    }
    else {
      coda_add_error_message(" for size expression");
    }
    coda_cursor_add_to_error_message(cursor_00);
    return -1;
  }
  if (iVar5 - 2U < 2) {
    cVar1 = pcVar11->read_type;
    if (9 < (uint)cVar1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                    ,0x329,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
    }
    if ((0x55U >> (cVar1 & 0x1f) & 1) == 0) {
      if ((0xaaU >> (cVar1 & 0x1f) & 1) == 0) {
        lVar7 = coda_ascii_parse_double(local_388,length,(double *)&local_348,1);
      }
      else {
        lVar7 = coda_ascii_parse_uint64(local_388,length,(uint64_t *)&local_348,1);
      }
    }
    else {
      lVar7 = coda_ascii_parse_int64(local_388,length,(int64_t *)&local_348,1);
    }
    if (lVar7 < 0) {
      return -1;
    }
    lVar7 = lVar7 << 3;
    local_3a8 = bit_size;
LAB_0011acbe:
    *local_3a8 = lVar7;
    return 0;
  }
  if (iVar5 != 4) {
    __assert_fail("type->type_class == coda_text_class",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                  ,0x335,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
  }
  switch(pcVar11[1].type_class) {
  case coda_record_class:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                  ,0x40f,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
  case coda_array_class:
    if (local_3b0->product->format != coda_format_ascii) {
      __assert_fail("cursor->product->format == coda_format_ascii",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                    ,0x339,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
    }
    iVar5 = (int)local_3b0->product[1].file_size;
    lVar7 = 8;
    if (iVar5 - 1U < 2) {
LAB_0011ab18:
      *bit_size = lVar7;
      return 0;
    }
    if (iVar5 != 0) {
      if (iVar5 != 3) {
        return 0;
      }
      lVar7 = 0x10;
      goto LAB_0011ab18;
    }
    if ((local_390[(long)local_3b0->n + -1].bit_offset & 7) != 0) {
      bVar14 = false;
      coda_set_error(-300,
                     "product error detected (ascii line separator does not start at byte boundary)"
                    );
      iVar5 = -1;
      goto joined_r0x0011af54;
    }
    bVar14 = false;
    iVar6 = coda_ascii_cursor_read_bytes(local_3b0,&local_3b1,0,1);
    iVar5 = -1;
    if (iVar6 != 0) goto joined_r0x0011af54;
    if (local_3b1 == '\r') {
      if (1 < local_3b0->product->file_size - (paVar4[(long)local_3b0->n + -1].bit_offset >> 3)) {
        iVar6 = coda_ascii_cursor_read_bytes(local_3b0,&local_3b1,1,1);
        if (iVar6 != 0) {
          bVar14 = false;
          goto joined_r0x0011af54;
        }
        if (local_3b1 == '\n') {
          *bit_size = 0x10;
          *(undefined4 *)&local_3b0->product[1].file_size = 3;
          goto LAB_0011b29f;
        }
      }
      *bit_size = 8;
      *(undefined4 *)&local_3b0->product[1].file_size = 2;
    }
    else {
      if (local_3b1 != '\n') {
        coda_str64(paVar4[(long)local_3b0->n + -1].bit_offset >> 3,(char *)&local_348);
        bVar14 = false;
        coda_set_error(-300,
                       "product error detected (invalid end-of-line sequence - not a carriage return or linefeed character - byte offset = %s)"
                       ,&local_348);
        goto joined_r0x0011af54;
      }
      *bit_size = 8;
      *(undefined4 *)&local_3b0->product[1].file_size = 1;
    }
LAB_0011b29f:
    iVar5 = 0;
    bVar14 = true;
    goto joined_r0x0011af54;
  case coda_integer_class:
  case coda_real_class:
    product = local_3b0->product;
    if (product->format == coda_format_ascii) {
      if ((local_390[(long)local_3b0->n + -1].bit_offset & 7) == 0) {
        if ((product[1].root_type == (coda_dynamic_type *)0x0) &&
           (iVar5 = coda_ascii_init_asciilines(product), iVar5 != 0)) {
          iVar5 = -1;
          bVar14 = false;
          goto joined_r0x0011af54;
        }
        pcVar3 = cursor_00->product;
        if (*(long *)&pcVar3[1].format != 0) {
          lVar8 = paVar4[(long)local_3b0->n + -1].bit_offset >> 3;
          lVar7 = *(long *)&pcVar3[1].format + -1;
          if (lVar7 != 0) {
            lVar10 = 0;
            lVar13 = lVar7;
            do {
              lVar7 = (lVar13 + lVar10) / 2;
              if (*(long *)(&(pcVar3[1].root_type)->backend + lVar7 * 2) <= lVar8) {
                lVar10 = lVar7 + 1;
                lVar7 = lVar13;
              }
              lVar13 = lVar7;
            } while (lVar7 != lVar10);
          }
          lVar8 = (*(long *)(&(pcVar3[1].root_type)->backend + lVar7 * 2) - lVar8) * 8;
          *bit_size = lVar8;
          bVar14 = true;
          if ((pcVar11[1].type_class == coda_real_class) &&
             (((lVar7 != *(long *)&pcVar3[1].format + -1 ||
               (*(int *)&pcVar3[1].product_definition != 0)) &&
              (*bit_size = lVar8 + -8, (int)pcVar3[1].file_size == 3)))) {
            *bit_size = lVar8 + -0x10;
          }
          iVar5 = 0;
          goto joined_r0x0011af54;
        }
        pcVar9 = "trying to read from an empty file";
        iVar5 = -0x12d;
      }
      else {
        pcVar9 = "product error detected (ascii line does not start at byte boundary)";
        iVar5 = -300;
      }
      bVar14 = false;
      coda_set_error(iVar5,pcVar9);
      iVar5 = -1;
      goto joined_r0x0011af54;
    }
    if ((local_390[(long)local_3b0->n + -1].bit_offset & 7U) == 0) {
      lVar8 = local_390[(long)local_3b0->n + -1].bit_offset >> 3;
      lVar7 = 0;
      lVar13 = product->file_size - lVar8;
      if (lVar8 < product->file_size) {
        do {
          iVar5 = read_bytes_in_bounds(local_3b0->product,lVar7 + lVar8,1,&local_348);
          if (iVar5 != 0) goto LAB_0011aff2;
        } while ((((char)local_348.product != '\n') && ((char)local_348.product != '\r')) &&
                (lVar7 = lVar7 + 1, lVar13 != lVar7));
      }
      if (pcVar11[1].type_class == coda_integer_class) {
        if (((char)local_348.product == '\r') && (lVar7 + 1 < lVar13)) {
          iVar5 = read_bytes_in_bounds(local_3b0->product,lVar7 + lVar8 + 1,1,&local_348);
          if (iVar5 != 0) {
LAB_0011aff2:
            iVar5 = -1;
            bVar14 = false;
            goto joined_r0x0011af54;
          }
          if ((char)local_348.product == '\n') {
            lVar7 = lVar7 + 1;
          }
        }
        lVar7 = lVar7 + 1;
      }
      *bit_size = lVar7 << 3;
      iVar5 = 0;
      bVar14 = true;
      goto joined_r0x0011af54;
    }
    pcVar9 = "product error detected (ascii line does not start at byte boundary)";
    break;
  case coda_text_class:
    if ((local_390[(long)local_3b0->n + -1].bit_offset & 7U) == 0) {
      lVar13 = local_390[(long)local_3b0->n + -1].bit_offset >> 3;
      lVar7 = local_3b0->product->file_size;
      lVar8 = 0;
      if (lVar13 < lVar7) {
        do {
          iVar5 = read_bytes_in_bounds(local_3b0->product,lVar13 + lVar8,1,&local_348);
          if (iVar5 != 0) goto LAB_0011aff2;
        } while ((((char)local_348.product == ' ') || ((char)local_348.product == '\t')) &&
                (lVar8 = lVar8 + 1, lVar7 - lVar13 != lVar8));
        lVar8 = lVar8 << 3;
      }
      *bit_size = lVar8;
      bVar14 = true;
      iVar5 = 0;
      goto joined_r0x0011af54;
    }
    pcVar9 = "product error detected (ascii white space does not start at byte boundary)";
    break;
  default:
    return 0;
  }
  bVar14 = false;
  coda_set_error(-300,pcVar9);
  iVar5 = -1;
joined_r0x0011af54:
  if (bVar14) {
    return 0;
  }
  return iVar5;
}

Assistant:

int coda_ascii_cursor_get_bit_size(const coda_cursor *cursor, int64_t *bit_size)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    coda_ascii_mappings *mappings = NULL;
    int64_t bit_offset = cursor->stack[cursor->n - 1].bit_offset;
    int64_t bit_size_boundary;
    char buffer[MAX_ASCII_NUMBER_LENGTH];
    long buffer_size = -1;
    int use_buffer = 0;


    if (type->bit_size >= 0)
    {
        *bit_size = type->bit_size;
        return 0;
    }

    if (type->type_class == coda_record_class || type->type_class == coda_array_class)
    {
        return coda_ascbin_cursor_get_bit_size(cursor, bit_size);
    }

    if (get_bit_size_boundary(cursor, &bit_size_boundary, -1) != 0)
    {
        return -1;
    }

    /* determine if there are ascii mappings */
    if (type->type_class == coda_integer_class || type->type_class == coda_real_class)
    {
        mappings = ((coda_type_number *)type)->mappings;
        use_buffer = (mappings != NULL || type->size_expr == NULL);
    }
    else if (type->type_class == coda_text_class)
    {
        if (type->size_expr == NULL && ((coda_type_text *)type)->special_text_type == ascii_text_default)
        {
            *bit_size = bit_size_boundary;
            return 0;
        }
        use_buffer = (type->size_expr == NULL);
    }
    else if (type->type_class == coda_special_class && ((coda_type_special *)type)->special_type == coda_special_time)
    {
        coda_type *base_type = ((coda_type_special *)type)->base_type;

        assert(base_type->type_class == coda_text_class);
        if (((coda_type_text *)base_type)->special_text_type == ascii_text_default)
        {
            *bit_size = bit_size_boundary;
            return 0;
        }
    }

    /* only read buffer when we are dealing with numbers (without size_expr) or if there are mappings */
    if (use_buffer)
    {
        if (bit_size_boundary >> 3 < MAX_ASCII_NUMBER_LENGTH)
        {
            buffer_size = (long)(bit_size_boundary >> 3);
        }
        else
        {
            buffer_size = MAX_ASCII_NUMBER_LENGTH;
        }

        if (read_bytes_in_bounds(cursor->product, bit_offset >> 3, buffer_size, buffer) != 0)
        {
            return -1;
        }
    }

    if (mappings != NULL)
    {
        /* try to determine size from ascii mappings */
        /* TODO: this goes wrong if we have a mapping with a string length that exceeds MAX_ASCII_NUMBER_LENGTH
         * so we should actually also take into account the max mapping length when determining buffer_size */
        if (parse_mapping_size(buffer, buffer_size, mappings, bit_size))
        {
            return 0;
        }
    }

    if (type->type_class == coda_special_class)
    {
        coda_cursor spec_cursor;

        spec_cursor = *cursor;
        if (coda_cursor_use_base_type_of_special_type(&spec_cursor) != 0)
        {
            return -1;
        }
        return coda_cursor_get_bit_size(&spec_cursor, bit_size);
    }

    if (type->size_expr != NULL)
    {
        if (coda_expression_eval_integer(type->size_expr, cursor, bit_size) != 0)
        {
            coda_add_error_message(" for size expression");
            coda_cursor_add_to_error_message(cursor);
            return -1;
        }
        if (type->bit_size == -8)
        {
            /* convert byte size to bit size */
            *bit_size *= 8;
        }
        if (*bit_size < 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "calculated size is negative (%ld bits)", (long)*bit_size);
            coda_cursor_add_to_error_message(cursor);
            return -1;
        }
        return 0;
    }

    /* parse the data to determine the size */
    if (type->type_class == coda_integer_class || type->type_class == coda_real_class)
    {
        long size;

        switch (type->read_type)
        {
            case coda_native_type_int8:
            case coda_native_type_int16:
            case coda_native_type_int32:
            case coda_native_type_int64:
                {
                    int64_t value;

                    size = coda_ascii_parse_int64(buffer, buffer_size, &value, 1);
                }
                break;
            case coda_native_type_uint8:
            case coda_native_type_uint16:
            case coda_native_type_uint32:
            case coda_native_type_uint64:
                {
                    uint64_t value;

                    size = coda_ascii_parse_uint64(buffer, buffer_size, &value, 1);
                }
                break;
            case coda_native_type_float:
            case coda_native_type_double:
                {
                    double value;

                    size = coda_ascii_parse_double(buffer, buffer_size, &value, 1);
                }
                break;
            default:
                assert(0);
                exit(1);
        }
        if (size < 0)
        {
            return -1;
        }
        *bit_size = size * 8;
        return 0;
    }

    /* only possible case left is the special text types */
    assert(type->type_class == coda_text_class);
    switch (((coda_type_text *)type)->special_text_type)
    {
        case ascii_text_line_separator:
            assert(cursor->product->format == coda_format_ascii);
            switch (((coda_ascii_product *)cursor->product)->end_of_line)
            {
                case eol_lf:
                case eol_cr:
                    *bit_size = 8;
                    break;
                case eol_crlf:
                    *bit_size = 16;
                    break;
                case eol_unknown:
                    {
                        uint8_t buffer[1];

                        /* accept either LINEFEED, CARRIAGE_RETURN, or CARRIAGE-RETURN/LINEFEED */

                        if ((cursor->stack[cursor->n - 1].bit_offset & 0x7) != 0)
                        {
                            coda_set_error(CODA_ERROR_PRODUCT, "product error detected (ascii line separator does not "
                                           "start at byte boundary)");
                            return -1;
                        }
                        if (coda_ascii_cursor_read_bytes(cursor, buffer, 0, 1) != 0)
                        {
                            return -1;
                        }

                        switch (*buffer)
                        {
                            case '\n': /* linefeed */
                                /* just a linefeed -> unix platform convention */
                                *bit_size = 8;
                                ((coda_ascii_product *)cursor->product)->end_of_line = eol_lf;
                                break;
                            case '\r': /* carriage return */
                                if (cursor->product->file_size - (cursor->stack[cursor->n - 1].bit_offset >> 3) >= 2)
                                {
                                    if (coda_ascii_cursor_read_bytes(cursor, buffer, 1, 1) != 0)
                                    {
                                        return -1;
                                    }
                                    if (*buffer == '\n')
                                    {
                                        /* carriage return followed by linefeed -> dos platform convention */
                                        *bit_size = 16;
                                        ((coda_ascii_product *)cursor->product)->end_of_line = eol_crlf;
                                        break;
                                    }
                                }
                                /* just a carriage return -> mac platform convention */
                                *bit_size = 8;
                                ((coda_ascii_product *)cursor->product)->end_of_line = eol_cr;
                                break;
                            default:
                                {
                                    char s[21];

                                    coda_str64(cursor->stack[cursor->n - 1].bit_offset >> 3, s);
                                    coda_set_error(CODA_ERROR_PRODUCT, "product error detected (invalid end-of-line "
                                                   "sequence - not a carriage return or linefeed character - byte "
                                                   "offset = %s)", s);
                                    return -1;
                                }
                        }
                    }
            }
            break;
        case ascii_text_line_with_eol:
        case ascii_text_line_without_eol:
            if (cursor->product->format == coda_format_ascii)
            {
                int64_t byte_offset;
                long *asciiline_end_offset;
                long bottom_index;
                long top_index;

                if ((cursor->stack[cursor->n - 1].bit_offset & 0x7) != 0)
                {
                    coda_set_error(CODA_ERROR_PRODUCT,
                                   "product error detected (ascii line does not start at byte boundary)");
                    return -1;
                }

                if (((coda_ascii_product *)cursor->product)->asciiline_end_offset == NULL)
                {
                    if (coda_ascii_init_asciilines(cursor->product) != 0)
                    {
                        return -1;
                    }
                }
                if (((coda_ascii_product *)cursor->product)->num_asciilines == 0)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_BOUNDS_READ, "trying to read from an empty file");
                    return -1;
                }

                bottom_index = 0;
                top_index = ((coda_ascii_product *)cursor->product)->num_asciilines - 1;
                asciiline_end_offset = ((coda_ascii_product *)cursor->product)->asciiline_end_offset;
                byte_offset = cursor->stack[cursor->n - 1].bit_offset >> 3;

                while (top_index != bottom_index)
                {
                    long index;

                    index = (bottom_index + top_index) / 2;
                    if (byte_offset < asciiline_end_offset[index])
                    {
                        top_index = index;
                    }
                    else
                    {
                        bottom_index = index + 1;
                    }
                }
                *bit_size = ((asciiline_end_offset[top_index] - byte_offset) << 3);

                /* remove length of eol if eol was not included in the asciiline type */
                /* and if the line does not end with eof */
                if (((coda_type_text *)type)->special_text_type == ascii_text_line_without_eol)
                {
                    if (!(top_index == ((coda_ascii_product *)cursor->product)->num_asciilines - 1 &&
                          ((coda_ascii_product *)cursor->product)->lastline_ending == eol_unknown))
                    {
                        *bit_size -= 8;
                        if (((coda_ascii_product *)cursor->product)->end_of_line == eol_crlf)
                        {
                            *bit_size -= 8;
                        }
                    }
                }
            }
            else
            {
                int64_t available_bytes;
                int64_t byte_offset;
                int64_t byte_size;
                char buffer[1];

                /* not a pure ascii file -> don't use asciiline cache */

                if ((cursor->stack[cursor->n - 1].bit_offset & 0x7) != 0)
                {
                    coda_set_error(CODA_ERROR_PRODUCT,
                                   "product error detected (ascii line does not start at byte boundary)");
                    return -1;
                }
                byte_offset = cursor->stack[cursor->n - 1].bit_offset >> 3;
                available_bytes = cursor->product->file_size - byte_offset;
                byte_size = 0;

                while (byte_size < available_bytes)
                {
                    if (read_bytes_in_bounds(cursor->product, byte_offset + byte_size, 1, buffer) != 0)
                    {
                        return -1;
                    }
                    if (*buffer == '\r' || *buffer == '\n')
                    {
                        break;
                    }
                    byte_size++;
                }
                if (((coda_type_text *)type)->special_text_type == ascii_text_line_with_eol)
                {
                    if (*buffer == '\r' && byte_size + 1 < available_bytes)
                    {
                        if (read_bytes_in_bounds(cursor->product, byte_offset + byte_size + 1, 1, buffer) != 0)
                        {
                            return -1;
                        }
                        if (*buffer == '\n')
                        {
                            byte_size++;
                        }
                    }
                    byte_size++;
                }
                *bit_size = (byte_size << 3);
            }
            break;
        case ascii_text_whitespace:
            {
                int64_t available_bytes;
                int64_t byte_offset;
                int64_t byte_size;
                char buffer[1];

                if ((cursor->stack[cursor->n - 1].bit_offset & 0x7) != 0)
                {
                    coda_set_error(CODA_ERROR_PRODUCT,
                                   "product error detected (ascii white space does not start at byte boundary)");
                    return -1;
                }
                byte_offset = cursor->stack[cursor->n - 1].bit_offset >> 3;
                available_bytes = cursor->product->file_size - byte_offset;
                byte_size = 0;

                while (byte_size < available_bytes)
                {
                    if (read_bytes_in_bounds(cursor->product, byte_offset + byte_size, 1, buffer) != 0)
                    {
                        return -1;
                    }
                    if (*buffer != ' ' && *buffer != '\t')
                    {
                        break;
                    }
                    byte_size++;
                }
                *bit_size = (byte_size << 3);
            }
            break;
        case ascii_text_default:
            assert(0);
            exit(1);
    }

    return 0;
}